

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedMachine.hpp
# Opt level: O0

void __thiscall
MachineTypes::TimedMachine::set_speed_multiplier(TimedMachine *this,double multiplier)

{
  Speaker *this_00;
  undefined8 *local_38;
  Speaker *speaker;
  AudioProducer *audio_producer;
  double multiplier_local;
  TimedMachine *this_local;
  
  if ((this->speed_multiplier_ != multiplier) || (NAN(this->speed_multiplier_) || NAN(multiplier)))
  {
    this->speed_multiplier_ = multiplier;
    if (this == (TimedMachine *)0x0) {
      local_38 = (undefined8 *)0x0;
    }
    else {
      local_38 = (undefined8 *)
                 __dynamic_cast(this,&typeinfo,&AudioProducer::typeinfo,0xfffffffffffffffe);
    }
    if ((local_38 != (undefined8 *)0x0) &&
       (this_00 = (Speaker *)(**(code **)*local_38)(), this_00 != (Speaker *)0x0)) {
      Outputs::Speaker::Speaker::set_input_rate_multiplier(this_00,(float)multiplier);
    }
  }
  return;
}

Assistant:

virtual void set_speed_multiplier(double multiplier) {
			if(speed_multiplier_ == multiplier) {
				return;
			}

			speed_multiplier_ = multiplier;

			auto audio_producer = dynamic_cast<AudioProducer *>(this);
			if(!audio_producer) return;

			auto speaker = audio_producer->get_speaker();
			if(speaker) {
				speaker->set_input_rate_multiplier(float(multiplier));
			}
		}